

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror_s.c
# Opt level: O3

errno_t strerror_s(char *s,rsize_t maxsize,errno_t errnum)

{
  size_t sVar1;
  char *__src;
  errno_t eVar2;
  
  sVar1 = strerrorlen_s(errnum);
  if (s == (char *)0x0 || (long)maxsize < 1) {
    eVar2 = 0x16;
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  }
  else {
    __src = strerror(errnum);
    if (sVar1 < maxsize) {
      strcpy(s,__src);
    }
    else {
      strncpy(s,__src,maxsize - 1);
      if (maxsize < 4) {
        s[maxsize - 1] = '\0';
      }
      else {
        builtin_strncpy(s + maxsize + -4,"...",4);
      }
    }
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

errno_t strerror_s( char * s, rsize_t maxsize, errno_t errnum )
{
    size_t len = strerrorlen_s( errnum );

    if ( s == NULL || maxsize > RSIZE_MAX || maxsize == 0 )
    {
        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    if ( len < maxsize )
    {
        strcpy( s, strerror( errnum ) );
    }
    else
    {
        strncpy( s, strerror( errnum ), maxsize - 1 );

        if ( maxsize > 3 )
        {
            strcpy( &s[ maxsize - 4 ], "..." );
        }
        else
        {
            s[ maxsize - 1 ] = '\0';
        }
    }

    return 0;
}